

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

universal_hash_function_t *
new_universal_hash_function
          (universal_hash_function_t *__return_storage_ptr__,size_t *seed,uint buckets)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  
  sVar2 = *seed * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  *seed = sVar2;
  auVar4._8_4_ = (int)(sVar2 >> 0x20);
  auVar4._0_8_ = sVar2;
  auVar4._12_4_ = 0x45300000;
  dVar5 = ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * 5.421010862427522e-20 *
          1.8446744073709552e+19;
  uVar3 = (ulong)dVar5;
  __return_storage_ptr__->mult = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3
  ;
  sVar2 = sVar2 * 0x5851f42d4c957f2d + 0x14057b7ef767814f;
  *seed = sVar2;
  auVar6._8_4_ = (int)(sVar2 >> 0x20);
  auVar6._0_8_ = sVar2;
  auVar6._12_4_ = 0x45300000;
  dVar5 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0)) * 5.421010862427522e-20 *
          1.8446744073709552e+19;
  uVar3 = (ulong)dVar5;
  __return_storage_ptr__->add = (long)(dVar5 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
  iVar1 = uint32_log2(buckets);
  __return_storage_ptr__->log2_buckets = iVar1;
  return __return_storage_ptr__;
}

Assistant:

universal_hash_function_t new_universal_hash_function( size_t * seed,
       unsigned buckets )
{
    universal_hash_function_t result;
    result.mult = (size_t) (SIZE_MAX * rand_next( seed ));
    result.add  = (size_t) (SIZE_MAX * rand_next( seed ));
    result.log2_buckets = int_log2( buckets );
    return result;
}